

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_aio_expire_loop(void *arg)

{
  ulong until;
  nni_aio_cancel_fn p_Var1;
  void *pvVar2;
  nni_time nVar3;
  nni_aio *pnVar4;
  void *cancel_arg;
  nni_aio_cancel_fn cancel_fn;
  uint32_t i;
  nni_aio *nxt;
  nni_time next;
  nni_aio *pnStack_360;
  nng_err rv;
  nni_aio *aio;
  nni_aio *expires [100];
  uint32_t exp_idx;
  nni_time now;
  nni_cv *cv;
  nni_mtx *mtx;
  nni_aio_expire_q *q;
  void *arg_local;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:aio:expire");
  nni_mtx_lock((nni_mtx *)arg);
  while( true ) {
    until = *(ulong *)((long)arg + 0x110);
    nVar3 = nni_clock();
    pnStack_360 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x60));
    if ((pnStack_360 == (nni_aio *)0x0) && ((*(byte *)((long)arg + 0x118) & 1) != 0)) break;
    if ((nVar3 < until) &&
       (((*(byte *)((long)arg + 0x119) & 1) == 0 || (pnStack_360 == (nni_aio *)0x0)))) {
      nni_cv_until((nni_cv *)((long)arg + 0x28),until);
    }
    else {
      *(undefined8 *)((long)arg + 0x110) = 0xffffffffffffffff;
      expires[99]._4_4_ = 0;
      while (pnStack_360 != (nni_aio *)0x0) {
        if ((((*(byte *)((long)arg + 0x119) & 1) == 0) && (nVar3 <= pnStack_360->a_expire)) ||
           (99 < expires[99]._4_4_)) {
          if (pnStack_360->a_expire < *(ulong *)((long)arg + 0x110)) {
            *(nni_time *)((long)arg + 0x110) = pnStack_360->a_expire;
          }
          pnStack_360 = (nni_aio *)nni_list_next((nni_list *)((long)arg + 0x60),pnStack_360);
        }
        else {
          expires[(ulong)expires[99]._4_4_ - 1] = pnStack_360;
          expires[99]._4_4_ = expires[99]._4_4_ + 1;
          pnVar4 = (nni_aio *)nni_list_next((nni_list *)((long)arg + 0x60),pnStack_360);
          nni_list_remove((nni_list *)((long)arg + 0x60),pnStack_360);
          pnStack_360->a_expiring = true;
          pnStack_360 = pnVar4;
        }
      }
      for (cancel_fn._4_4_ = 0; cancel_fn._4_4_ < expires[99]._4_4_;
          cancel_fn._4_4_ = cancel_fn._4_4_ + 1) {
        pnVar4 = expires[(ulong)cancel_fn._4_4_ - 1];
        if ((*(byte *)((long)arg + 0x119) & 1) == 0) {
          if ((pnVar4->a_expire_ok & 1U) == 0) {
            next._4_4_ = NNG_ETIMEDOUT;
          }
          else {
            pnVar4->a_expire_ok = false;
            next._4_4_ = NNG_OK;
          }
        }
        else {
          next._4_4_ = NNG_ESTOPPED;
          pnVar4->a_stop = true;
        }
        p_Var1 = pnVar4->a_cancel_fn;
        pvVar2 = pnVar4->a_cancel_arg;
        pnVar4->a_cancel_fn = (nni_aio_cancel_fn)0x0;
        pnVar4->a_cancel_arg = (void *)0x0;
        if ((pnVar4->a_sleep & 1U) == 0) {
          if (p_Var1 != (nni_aio_cancel_fn)0x0) {
            nni_mtx_unlock((nni_mtx *)arg);
            (*p_Var1)(pnVar4,pvVar2,next._4_4_);
            nni_mtx_lock((nni_mtx *)arg);
          }
        }
        else {
          pnVar4->a_result = next._4_4_;
          pnVar4->a_sleep = false;
          nni_task_dispatch(&pnVar4->a_task);
        }
        pnVar4->a_expiring = false;
      }
      nni_cv_wake((nni_cv *)((long)arg + 0x28));
    }
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
nni_aio_expire_loop(void *arg)
{
	nni_aio_expire_q *q   = arg;
	nni_mtx          *mtx = &q->eq_mtx;
	nni_cv           *cv  = &q->eq_cv;
	nni_time          now;
	uint32_t          exp_idx;
	nni_aio          *expires[NNI_EXPIRE_BATCH];

	nni_thr_set_name(NULL, "nng:aio:expire");

	nni_mtx_lock(mtx);

	for (;;) {
		nni_aio *aio;
		nng_err  rv;
		nni_time next;

		next = q->eq_next;
		now  = nni_clock();

		// Each time we wake up, we scan the entire list of elements.
		// We scan forward, moving up to NNI_EXPIRE_Q_SIZE elements
		// (a batch) to a saved array of things we are going to cancel.
		// This mostly runs in O(n), provided you don't have many
		// elements (> NNI_EXPIRE_Q_SIZE) all expiring simultaneously.
		aio = nni_list_first(&q->eq_list);
		if ((aio == NULL) && (q->eq_exit)) {
			nni_mtx_unlock(mtx);
			return;
		}
		if (now < next && !(q->eq_stop && aio != NULL)) {
			// nothing to do!
			nni_cv_until(cv, next);
			continue;
		}
		q->eq_next = NNI_TIME_NEVER;
		exp_idx    = 0;
		while (aio != NULL) {
			if ((q->eq_stop || aio->a_expire < now) &&
			    (exp_idx < NNI_EXPIRE_BATCH)) {
				nni_aio *nxt;

				// This one is expiring.
				expires[exp_idx++] = aio;
				// save the next node
				nxt = nni_list_next(&q->eq_list, aio);
				nni_list_remove(&q->eq_list, aio);
				// Place a temporary hold on the aio.
				// This prevents it from being destroyed.
				aio->a_expiring = true;
				aio             = nxt;
				continue;
			}
			if (aio->a_expire < q->eq_next) {
				q->eq_next = aio->a_expire;
			}
			aio = nni_list_next(&q->eq_list, aio);
		}

		for (uint32_t i = 0; i < exp_idx; i++) {
			aio = expires[i];
			if (q->eq_stop) {
				rv          = NNG_ESTOPPED;
				aio->a_stop = true;
			} else if (aio->a_expire_ok) {
				aio->a_expire_ok = false;
				rv               = 0;
			} else {
				rv = NNG_ETIMEDOUT;
			}

			nni_aio_cancel_fn cancel_fn  = aio->a_cancel_fn;
			void             *cancel_arg = aio->a_cancel_arg;

			aio->a_cancel_fn  = NULL;
			aio->a_cancel_arg = NULL;

			// We let the cancel function handle the completion.
			// If there is no cancellation function, then we cannot
			// terminate the aio - we've tried, but it has to run
			// to its natural conclusion.
			//
			// For the special case of sleeping, we don't need to
			// drop the lock and call the cancel function, we are
			// already doing it right here!
			if (aio->a_sleep) {
				aio->a_result = rv;
				aio->a_sleep  = false;
				nni_task_dispatch(&aio->a_task);
			} else if (cancel_fn != NULL) {
				nni_mtx_unlock(mtx);
				cancel_fn(aio, cancel_arg, rv);
				nni_mtx_lock(mtx);
			}
			aio->a_expiring = false;
		}
		nni_cv_wake(cv);
	}
}